

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_3dcd0a::ArgParser::argUnderlay(ArgParser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var1;
  size_type sVar2;
  string local_38;
  
  QPDFJob::Config::underlay((Config *)&local_38);
  sVar2 = local_38._M_string_length;
  _Var1._M_p = local_38._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)0x0;
  local_38._M_string_length = 0;
  this_00 = (this->c_uo).super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->c_uo).super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_p;
  (this->c_uo).super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_string_length);
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"underlay/overlay","");
  QPDFArgParser::selectOptionTable(&this->ap,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
ArgParser::argUnderlay()
{
    this->c_uo = c_main->underlay();
    this->ap.selectOptionTable(O_UNDERLAY_OVERLAY);
}